

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFileFormat.cpp
# Opt level: O0

void __thiscall
RegionFileFormat::saveRegion
          (RegionFileFormat *this,Board *board,RegionCoords *regionCoords,Region *region)

{
  format_string_t<long_&> fmt;
  format_string_t<std::pair<int,_int>_> fmt_00;
  format_string_t<std::pair<int,_int>_> fmt_01;
  format_string_t<const_int_&,_const_int_&> fmt_02;
  format_string_t<std::pair<int,_int>,_const_unsigned_int_&,_const_unsigned_int_&> fmt_03;
  format_string_t<std::pair<int,_int>,_unsigned_long> fmt_04;
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  runtime_error *prVar4;
  pointer ppVar5;
  size_type sVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  pair<int,_int> pVar9;
  unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
  *puVar10;
  undefined8 in_RCX;
  Board *in_RSI;
  FileStorage *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar12;
  uint32_t serializedSize_1;
  int headerIndex_1;
  pair<int,_int> regionOffset_1;
  pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_> *serialized_1;
  iterator __end1_1;
  iterator __begin1_1;
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  *__range1_1;
  uint32_t i_1;
  repr chunkCoords_1;
  int i;
  uint32_t lastOffset;
  char emptySector [256];
  uint32_t currentSectors;
  uint32_t sectorCount;
  uint32_t serializedSize;
  int headerIndex;
  pair<int,_int> regionOffset;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
  serialized;
  unsigned_long *chunkCoords;
  iterator __end1;
  iterator __begin1;
  Region *__range1;
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  serializedChunks;
  bool reallocationRequired;
  streamsize regionFileLength;
  ChunkHeader header [1024];
  fstream regionFile;
  path regionFilename;
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe598;
  int in_stack_ffffffffffffe5a0;
  int in_stack_ffffffffffffe5a4;
  mapped_type *in_stack_ffffffffffffe5a8;
  undefined4 in_stack_ffffffffffffe5b0;
  format in_stack_ffffffffffffe5b4;
  mapped_type *in_stack_ffffffffffffe5b8;
  unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
  *in_stack_ffffffffffffe5c0;
  path *in_stack_ffffffffffffe5c8;
  pair<int,_int> in_stack_ffffffffffffe5d0;
  undefined7 in_stack_ffffffffffffe5d8;
  undefined1 in_stack_ffffffffffffe5df;
  _Rb_tree_const_iterator<unsigned_long> in_stack_ffffffffffffe5e0;
  ChunkHeader *in_stack_ffffffffffffe5e8;
  int iVar13;
  undefined4 in_stack_ffffffffffffe5f0;
  uint uVar14;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
  in_stack_ffffffffffffe610;
  basic_string_view<char> local_1938;
  size_type local_1928;
  pair<int,_int> local_1920;
  basic_string_view<char> local_1918;
  _Base_ptr local_1908;
  undefined1 local_1900;
  uint local_18f8;
  int local_18f4;
  pair<int,_int> local_18f0;
  reference local_18e8;
  _Self local_18e0;
  _Self local_18d8;
  undefined1 *local_18d0;
  uint local_18c4;
  _Base_ptr local_18c0;
  undefined1 local_18b8;
  repr local_1898;
  int local_1890;
  uint local_188c;
  undefined1 local_1888 [256];
  pair<int,_int> local_1788;
  basic_string_view<char> local_1780;
  uint local_176c;
  pair<int,_int> local_1768;
  basic_string_view<char> local_1760;
  uint local_174c;
  int local_1748;
  int local_1744;
  pair<int,_int> local_1740;
  _Base_ptr local_1738;
  undefined1 local_1730;
  _Base_ptr local_1710;
  undefined1 local_1708;
  _Base_ptr local_1700;
  reference local_16f8;
  _Self local_16f0;
  _Self local_16e8;
  undefined8 local_16e0;
  undefined1 local_16d8 [54];
  byte local_16a2;
  undefined1 local_16a1;
  string local_1660 [32];
  basic_string_view<char> local_1640;
  undefined1 local_1629;
  string local_1528 [39];
  undefined1 local_1501;
  string local_1400 [32];
  long local_13e0;
  uint local_13d8 [1026];
  basic_string_view<char> local_3d0;
  undefined1 local_3c0 [624];
  string local_150 [48];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  char local_a0 [32];
  undefined8 local_80;
  Board *local_70;
  char *local_60;
  basic_string_view<char> *local_58;
  char *local_50;
  basic_string_view<char> *local_48;
  char *local_40;
  basic_string_view<char> *local_38;
  char *local_30;
  basic_string_view<char> *local_28;
  char *local_20;
  basic_string_view<char> *local_18;
  char *local_10;
  basic_string_view<char> *local_8;
  
  local_80 = in_RCX;
  local_70 = in_RSI;
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a8,
                 (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5d0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe5a8,
                 (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  ghc::filesystem::path::path
            ((path *)in_stack_ffffffffffffe5c0,(string_type *)in_stack_ffffffffffffe5b8,
             in_stack_ffffffffffffe5b4);
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_100);
  std::__cxx11::string::~string(local_120);
  FileStorage::getFilename(in_RDI);
  ghc::filesystem::path::path<char[7],ghc::filesystem::path>
            ((path *)in_stack_ffffffffffffe5c0,(char (*) [7])in_stack_ffffffffffffe5b8,
             in_stack_ffffffffffffe5b4);
  ghc::filesystem::operator/(in_stack_ffffffffffffe5c8,(path *)in_stack_ffffffffffffe5c0);
  ghc::filesystem::operator/(in_stack_ffffffffffffe5c8,(path *)in_stack_ffffffffffffe5c0);
  ghc::filesystem::path::operator=
            ((path *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
             (path *)in_stack_ffffffffffffe598);
  ghc::filesystem::path::~path((path *)0x1f4862);
  ghc::filesystem::path::~path((path *)0x1f486f);
  ghc::filesystem::path::~path((path *)0x1f487c);
  _Var3 = std::operator|(_S_in,_S_out);
  std::operator|(_Var3,_S_bin);
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
            ((basic_fstream<char,_std::char_traits<char>_> *)in_stack_ffffffffffffe5e0._M_node,
             (path *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
             in_stack_ffffffffffffe5d0.second);
  local_58 = &local_3d0;
  local_60 = "Saving chunks for region {}, {}.";
  ::fmt::v11::basic_string_view<char>::basic_string_view
            (local_58,"Saving chunks for region {}, {}.",0x20);
  fmt_02.str.size_ = (size_t)in_stack_ffffffffffffe5c0;
  fmt_02.str.data_ = (char *)in_stack_ffffffffffffe5b8;
  spdlog::debug<int_const&,int_const&>
            (fmt_02,(int *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
             (int *)in_stack_ffffffffffffe5a8);
  memset(local_13d8,0,0x1000);
  local_13e0 = 0;
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    _Var3 = std::operator|(_S_out,_S_bin);
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              ((basic_fstream<char,_std::char_traits<char>_> *)local_3c0,local_a0,_Var3);
    bVar1 = std::fstream::is_open();
    if ((bVar1 & 1) == 0) {
      local_16a1 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_ffffffffffffe5a8);
      std::operator+((char *)in_stack_ffffffffffffe5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::runtime_error::runtime_error(prVar4,local_1660);
      local_16a1 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::numeric_limits<long>::max();
    std::istream::ignore((long)local_3c0);
    local_13e0 = std::istream::gcount();
    std::ios::clear((int)local_3c0 + (int)*(undefined8 *)(local_3c0._0_8_ + -0x18));
    std::istream::seekg((long)local_3c0,_S_beg);
    if (local_13e0 < 0x1000) {
      local_1501 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_ffffffffffffe5a8);
      std::operator+((char *)in_stack_ffffffffffffe5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::__cxx11::to_string((long)in_stack_ffffffffffffe5e8);
      iVar13 = (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::__cxx11::to_string(iVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::runtime_error::runtime_error(prVar4,local_1400);
      local_1501 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_13e0 % 0x100 != 0) {
      local_1629 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_((path *)in_stack_ffffffffffffe5a8);
      std::operator+((char *)in_stack_ffffffffffffe5a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::__cxx11::to_string((long)in_stack_ffffffffffffe5e8);
      iVar13 = (int)((ulong)in_stack_ffffffffffffe5e8 >> 0x20);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::__cxx11::to_string(iVar13);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe5a8,
                     (char *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
      std::runtime_error::runtime_error(prVar4,local_1528);
      local_1629 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48 = &local_1640;
    local_50 = "Found existing region file with {} bytes.";
    ::fmt::v11::basic_string_view<char>::basic_string_view
              (local_48,"Found existing region file with {} bytes.",0x29);
    fmt.str.size_._0_4_ = in_stack_ffffffffffffe5b0;
    fmt.str.data_ = (char *)in_stack_ffffffffffffe5a8;
    fmt.str.size_._4_4_ = in_stack_ffffffffffffe5b4;
    spdlog::debug<long&>(fmt,(long *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
    readRegionHeader((ChunkHeader *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     (path *)in_stack_ffffffffffffe5a8,
                     (istream *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  }
  std::ostream::seekp((long)(local_3c0 + 0x10),_S_beg);
  local_16a2 = 0;
  std::
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
         *)0x1f5327);
  local_16e0 = local_80;
  local_16e8._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::begin
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  in_stack_ffffffffffffe598);
  local_16f0._M_node =
       (_Base_ptr)
       std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                 ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                  in_stack_ffffffffffffe598);
  while (bVar2 = std::operator!=(&local_16e8,&local_16f0), bVar2) {
    local_16f8 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                           ((_Rb_tree_const_iterator<unsigned_long> *)0x1f538c);
    Board::getLoadedChunks(local_70);
    std::
    unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
    ::at((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
          *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
         (key_type *)in_stack_ffffffffffffe598);
    Chunk::serialize((Chunk *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8));
    pVar11 = std::
             map<unsigned_long,std::vector<char,std::allocator<char>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
             ::emplace<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                       ((map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                        (unsigned_long *)in_stack_ffffffffffffe5a8,
                        (vector<char,_std::allocator<char>_> *)
                        CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
    local_1738 = (_Base_ptr)pVar11.first._M_node;
    local_1730 = pVar11.second;
    local_1710 = local_1738;
    local_1708 = local_1730;
    local_1700 = local_1738;
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
    if (0 < local_13e0) {
      local_1740 = toRegionOffset((repr)in_stack_ffffffffffffe598);
      local_1744 = local_1740.first + local_1740.second * 0x20;
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
                             *)0x1f54d8);
      sVar7 = std::vector<char,_std::allocator<char>_>::size(&ppVar5->second);
      local_1748 = (int)sVar7 + 4;
      local_174c = (int)sVar7 + 0x103U >> 8;
      if (local_13d8[local_1744] >> 0x18 != 0) {
        std::
        _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
        ::operator->((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
                      *)0x1f5533);
        bVar2 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)
                           CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
        if (bVar2) {
          local_38 = &local_1760;
          local_40 = "Chunk {} requires 0 sectors, removing.";
          ::fmt::v11::basic_string_view<char>::basic_string_view
                    (local_38,"Chunk {} requires 0 sectors, removing.",0x26);
          local_1768 = ChunkCoords::toPair((repr)in_stack_ffffffffffffe598);
          fmt_00.str.size_._0_4_ = in_stack_ffffffffffffe5b0;
          fmt_00.str.data_ = (char *)in_stack_ffffffffffffe5a8;
          fmt_00.str.size_._4_4_ = in_stack_ffffffffffffe5b4;
          spdlog::debug<std::pair<int,int>>
                    (fmt_00,(pair<int,_int> *)
                            CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
          local_16a2 = 1;
        }
        else if (local_13d8[local_1744] >> 0x18 < local_174c) {
          local_176c = local_13d8[local_1744] >> 0x18;
          local_28 = &local_1780;
          local_30 = "Chunk {} requires {} sectors but only {} are allocated.";
          ::fmt::v11::basic_string_view<char>::basic_string_view
                    (local_28,"Chunk {} requires {} sectors but only {} are allocated.",0x37);
          local_1788 = ChunkCoords::toPair((repr)in_stack_ffffffffffffe598);
          fmt_03.str.size_ = (size_t)in_stack_ffffffffffffe5c0;
          fmt_03.str.data_ = (char *)in_stack_ffffffffffffe5b8;
          spdlog::debug<std::pair<int,int>,unsigned_int_const&,unsigned_int_const&>
                    (fmt_03,(pair<int,_int> *)
                            CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                     (uint *)in_stack_ffffffffffffe5a8,
                     (uint *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
          local_16a2 = 1;
        }
      }
    }
    std::_Rb_tree_const_iterator<unsigned_long>::operator++
              ((_Rb_tree_const_iterator<unsigned_long> *)
               CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  }
  memset(local_1888,0,0x100);
  local_188c = 0x10;
  if ((local_16a2 & 1) == 0) {
    if (local_13e0 == 0) {
      for (local_18c4 = 0; local_18c4 < local_188c; local_18c4 = local_18c4 + 1) {
        std::ostream::write(local_3c0 + 0x10,(long)local_1888);
      }
    }
    else {
      local_188c = (uint)(local_13e0 / 0x100);
    }
  }
  else {
    spdlog::debug<char[39]>((char (*) [39])0x1f5741);
    for (local_1890 = 0; local_1890 < 0x400; local_1890 = local_1890 + 1) {
      local_1898 = ChunkCoords::pack(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0);
      if ((local_13d8[local_1890] >> 0x18 != 0) &&
         (sVar6 = std::
                  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
                  ::count((map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                          (key_type *)in_stack_ffffffffffffe5a8), sVar6 == 0)) {
        readChunk(in_stack_ffffffffffffe5e8,(int)((ulong)in_stack_ffffffffffffe5e0._M_node >> 0x20),
                  (path *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                  (istream *)in_stack_ffffffffffffe5d0);
        pVar11 = std::
                 map<unsigned_long,std::vector<char,std::allocator<char>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
                 ::emplace<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                           ((map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                            (unsigned_long *)in_stack_ffffffffffffe5a8,
                            (vector<char,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
        in_stack_ffffffffffffe610 = pVar11.first._M_node;
        local_18b8 = pVar11.second;
        local_18c0 = in_stack_ffffffffffffe610._M_node;
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
      }
      local_13d8[local_1890] = local_13d8[local_1890] & 0xff000000;
      local_13d8[local_1890] = local_13d8[local_1890] & 0xffffff;
    }
  }
  local_18d0 = local_16d8;
  local_18d8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffe598);
  local_18e0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffe598);
  while (bVar2 = std::operator!=(&local_18d8,&local_18e0), bVar2) {
    local_18e8 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
                 ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
                              *)0x1f59d3);
    local_18f0 = toRegionOffset((repr)in_stack_ffffffffffffe598);
    local_18f4 = local_18f0.first + local_18f0.second * 0x20;
    sVar7 = std::vector<char,_std::allocator<char>_>::size(&local_18e8->second);
    local_18f8 = (int)sVar7 + 4;
    bVar2 = std::vector<char,_std::allocator<char>_>::empty
                      ((vector<char,_std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
    if (bVar2) {
      std::
      map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
      ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                    *)in_stack_ffffffffffffe5e0._M_node,
                   (key_type *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8));
      std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
                ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
                 (key_type *)in_stack_ffffffffffffe598);
    }
    else {
      uVar14 = local_18f8;
      bVar1 = std::numeric_limits<unsigned_char>::max();
      if ((uint)bVar1 << 8 < uVar14) {
        local_18 = &local_1918;
        local_20 = "Failed to save chunk at {} (serialized to {} bytes).";
        ::fmt::v11::basic_string_view<char>::basic_string_view
                  (local_18,"Failed to save chunk at {} (serialized to {} bytes).",0x34);
        in_stack_ffffffffffffe5d0 = ChunkCoords::toPair((repr)in_stack_ffffffffffffe598);
        local_1920 = in_stack_ffffffffffffe5d0;
        local_1928 = std::vector<char,_std::allocator<char>_>::size(&local_18e8->second);
        fmt_04.str.size_ = (size_t)in_stack_ffffffffffffe5c0;
        fmt_04.str.data_ = (char *)in_stack_ffffffffffffe5b8;
        spdlog::error<std::pair<int,int>,unsigned_long>
                  (fmt_04,(pair<int,_int> *)
                          CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                   (unsigned_long *)in_stack_ffffffffffffe5a8);
      }
      else {
        pmVar8 = std::
                 map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                 ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                               *)in_stack_ffffffffffffe5e0._M_node,
                              (key_type *)
                              CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8));
        iVar13 = (int)((ulong)pmVar8 >> 0x20);
        pVar12 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                 insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)in_stack_ffffffffffffe5c0,
                        (value_type_conflict1 *)in_stack_ffffffffffffe5b8);
        in_stack_ffffffffffffe5e0 = pVar12.first._M_node;
        in_stack_ffffffffffffe5df = pVar12.second;
        local_8 = &local_1938;
        local_10 = "Writing chunk {}.";
        local_1908 = in_stack_ffffffffffffe5e0._M_node;
        local_1900 = in_stack_ffffffffffffe5df;
        ::fmt::v11::basic_string_view<char>::basic_string_view(local_8,"Writing chunk {}.",0x11);
        pVar9 = ChunkCoords::toPair((repr)in_stack_ffffffffffffe598);
        fmt_01.str.size_._0_4_ = in_stack_ffffffffffffe5b0;
        fmt_01.str.data_ = (char *)in_stack_ffffffffffffe5a8;
        fmt_01.str.size_._4_4_ = in_stack_ffffffffffffe5b4;
        spdlog::debug<std::pair<int,int>>
                  (fmt_01,(pair<int,_int> *)
                          CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
        in_stack_ffffffffffffe5c0 = Board::getLoadedChunks(local_70);
        in_stack_ffffffffffffe5b8 =
             std::
             unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
             ::at((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
                  (key_type *)in_stack_ffffffffffffe598);
        Chunk::debugPrintChunk
                  ((Chunk *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0));
        in_stack_ffffffffffffe598 =
             (map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
              *)(local_3c0 + 0x10);
        writeChunk((ChunkHeader *)CONCAT44(uVar14,in_stack_ffffffffffffe5f0),iVar13,
                   (char *)in_stack_ffffffffffffe5e0._M_node,
                   (uint32_t *)CONCAT17(in_stack_ffffffffffffe5df,in_stack_ffffffffffffe5d8),
                   (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffe5d0,(path *)pVar9,
                   (ostream *)in_stack_ffffffffffffe610._M_node);
        puVar10 = Board::getLoadedChunks(local_70);
        in_stack_ffffffffffffe5b0 = SUB84(puVar10,0);
        in_stack_ffffffffffffe5b4 = (format)((ulong)puVar10 >> 0x20);
        in_stack_ffffffffffffe5a8 =
             std::
             unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
             ::at((unordered_map<unsigned_long,_Chunk,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>_>
                   *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0),
                  (key_type *)in_stack_ffffffffffffe598);
        Chunk::markAsSaved((Chunk *)0x1f5cd7);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  }
  writeRegionHeader((ChunkHeader *)CONCAT44(in_stack_ffffffffffffe5b4,in_stack_ffffffffffffe5b0),
                    (path *)in_stack_ffffffffffffe5a8,
                    (ostream *)CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  std::fstream::close();
  std::
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~map((map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
          *)0x1f5d28);
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::~basic_fstream
            ((basic_fstream<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffe5a4,in_stack_ffffffffffffe5a0));
  ghc::filesystem::path::~path((path *)0x1f5d42);
  return;
}

Assistant:

void RegionFileFormat::saveRegion(Board& board, const RegionCoords& regionCoords, const Region& region) {
    fs::path regionFilename = std::to_string(regionCoords.first) + "." + std::to_string(regionCoords.second) + ".dat";
    regionFilename = getFilename() / "region" / regionFilename;
    fs::fstream regionFile(regionFilename, std::ios::in | std::ios::out | std::ios::binary);
    spdlog::debug("Saving chunks for region {}, {}.", regionCoords.first, regionCoords.second);

    ChunkHeader header[REGION_WIDTH * REGION_WIDTH] = {};
    std::streamsize regionFileLength = 0;
    if (regionFile.is_open()) {
        // Determine number of bytes we can read from the file, should match the file size in most cases.
        // https://stackoverflow.com/questions/22984956/tellg-function-give-wrong-size-of-file/22986486#22986486
        regionFile.ignore(std::numeric_limits<std::streamsize>::max());
        regionFileLength = regionFile.gcount();
        regionFile.clear();
        regionFile.seekg(0, std::ios::beg);
        if (regionFileLength < 4 * REGION_WIDTH * REGION_WIDTH) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is less than minimum size of " + std::to_string(4 * REGION_WIDTH * REGION_WIDTH) + " bytes."
            );
        }
        if (regionFileLength % SECTOR_SIZE != 0) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is not evenly divisible by " + std::to_string(SECTOR_SIZE) + " byte sectors."
            );
        }

        spdlog::debug("Found existing region file with {} bytes.", regionFileLength);
        readRegionHeader(header, regionFilename, regionFile);
    } else {
        regionFile.open(regionFilename, std::ios::out | std::ios::binary);
        if (!regionFile.is_open()) {
            throw std::runtime_error("\"" + regionFilename.string() + "\": unable to open file for writing.");
        }
    }
    regionFile.seekp(0, std::ios::beg);

    bool reallocationRequired = false;
    std::map<ChunkCoords::repr, std::vector<char>> serializedChunks;
    for (const auto& chunkCoords : region) {
        const auto serialized = serializedChunks.emplace(chunkCoords, board.getLoadedChunks().at(chunkCoords).serialize()).first;
        if (regionFileLength > 0) {
            const auto regionOffset = toRegionOffset(chunkCoords);
            const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
            const uint32_t serializedSize = static_cast<uint32_t>(serialized->second.size() + sizeof(serializedSize));
            const uint32_t sectorCount = (serializedSize + SECTOR_SIZE - 1) / SECTOR_SIZE;
            if (header[headerIndex].sectors > 0) {
                if (serialized->second.empty()) {
                    spdlog::debug("Chunk {} requires 0 sectors, removing.", ChunkCoords::toPair(chunkCoords));
                    reallocationRequired = true;
                } else if (header[headerIndex].sectors < sectorCount) {
                    const uint32_t currentSectors = header[headerIndex].sectors;
                    spdlog::debug("Chunk {} requires {} sectors but only {} are allocated.", ChunkCoords::toPair(chunkCoords), sectorCount, currentSectors);
                    reallocationRequired = true;
                }
            }
        }
    }

    const char emptySector[SECTOR_SIZE] = {};
    uint32_t lastOffset = 4 * REGION_WIDTH * REGION_WIDTH / SECTOR_SIZE;
    if (reallocationRequired) {
        // Read in all chunks and wipe header.
        spdlog::debug("Preparing all chunks for reallocation.");
        for (int i = 0; i < REGION_WIDTH * REGION_WIDTH; ++i) {
            const auto chunkCoords = ChunkCoords::pack(i % REGION_WIDTH + regionCoords.first * REGION_WIDTH, i / REGION_WIDTH + regionCoords.second * REGION_WIDTH);
            if (header[i].sectors > 0 && serializedChunks.count(chunkCoords) == 0) {
                serializedChunks.emplace(
                    chunkCoords,
                    readChunk(header, i, regionFilename, regionFile)
                );
            }
            header[i].offset = 0;
            header[i].sectors = 0;
        }
    } else if (regionFileLength == 0) {
        // Write empty header.
        for (uint32_t i = 0; i < lastOffset; ++i) {
            regionFile.write(emptySector, SECTOR_SIZE);
        }
    } else {
        lastOffset = static_cast<uint32_t>(regionFileLength / SECTOR_SIZE);
    }

    // Write chunks.
    for (const auto& serialized : serializedChunks) {
        const auto regionOffset = toRegionOffset(serialized.first);
        const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
        const uint32_t serializedSize = static_cast<uint32_t>(serialized.second.size() + sizeof(serializedSize));
        if (serialized.second.empty()) {
            savedRegions_[regionCoords].erase(serialized.first);
            continue;
        } else if (serializedSize <= std::numeric_limits<uint8_t>::max() * static_cast<uint32_t>(SECTOR_SIZE)) {
            savedRegions_[regionCoords].insert(serialized.first);
        } else {
            // FIXME unable to save this chunk, too much data
            // FIXME this check should be moved into writeChunk().
            spdlog::error("Failed to save chunk at {} (serialized to {} bytes).", ChunkCoords::toPair(serialized.first), serialized.second.size());
            continue;
        }

        spdlog::debug("Writing chunk {}.", ChunkCoords::toPair(serialized.first));
        board.getLoadedChunks().at(serialized.first).debugPrintChunk();
        writeChunk(header, headerIndex, emptySector, lastOffset, serialized.second, regionFilename, regionFile);
        board.getLoadedChunks().at(serialized.first).markAsSaved();
    }

    // Write (filled) header.
    writeRegionHeader(header, regionFilename, regionFile);

    // FIXME make a check if the regionFileLength is greater than length from lastOffset to determine if we need to
    // truncate the file with fs::resize_file

    regionFile.close();

    // FIXME need to clean up empty chunks (or should we do this after all regions have been saved?).


}